

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entry_iterator.cpp
# Opt level: O2

void __thiscall Pathie::entry_iterator::open_native_handle(entry_iterator *this)

{
  DIR *__dirp;
  dirent *pdVar1;
  ErrnoError *this_00;
  int *piVar2;
  allocator local_71;
  string local_70;
  string local_50;
  string nstr;
  
  Path::native_abi_cxx11_(&nstr,this->mp_directory);
  __dirp = opendir(nstr._M_dataplus._M_p);
  this->mp_cur = __dirp;
  if (__dirp != (DIR *)0x0) {
    pdVar1 = readdir(__dirp);
    std::__cxx11::string::string((string *)&local_70,pdVar1->d_name,&local_71);
    filename_to_utf8(&local_50,&local_70);
    Path::operator=(this->mp_cur_path,&local_50);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    return;
  }
  this_00 = (ErrnoError *)__cxa_allocate_exception(0x30);
  piVar2 = __errno_location();
  ErrnoError::ErrnoError(this_00,*piVar2);
  __cxa_throw(this_00,&ErrnoError::typeinfo,GlobError::~GlobError);
}

Assistant:

void entry_iterator::open_native_handle()
{
#if defined(_PATHIE_UNIX)
  std::string nstr = mp_directory->native();
  mp_cur = opendir(nstr.c_str());

  if (mp_cur) {
    struct dirent* p_dirent = readdir(static_cast<DIR*>(mp_cur));
    *mp_cur_path = filename_to_utf8(p_dirent->d_name);
  }
  else {
    throw(Pathie::ErrnoError(errno));
  }
#elif defined(_WIN32)
  std::wstring utf16 = utf8_to_utf16(mp_directory->str() + "/*");
  WIN32_FIND_DATAW finddata;

  mp_cur = FindFirstFileW(utf16.c_str(), &finddata);
  if (static_cast<HANDLE>(mp_cur) == INVALID_HANDLE_VALUE) {
    DWORD err = GetLastError();
    mp_cur = NULL;
    throw(Pathie::WindowsError(err));
  }
  else {
    *mp_cur_path = utf16_to_utf8(finddata.cFileName);
  }
#else
#error Unsupported system
#endif
}